

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clique.cc
# Opt level: O1

SearchResult __thiscall
anon_unknown.dwarf_66f1e::CliqueRunner::expand<false>
          (CliqueRunner *this,int depth,unsigned_long_long *nodes,unsigned_long_long *find_nodes,
          unsigned_long_long *prove_nodes,vector<int,_std::allocator<int>_> *c,SVOBitset *p,
          conditional_t<false,_const_SVOBitset_&,_int> a,int spacepos)

{
  ulong *puVar1;
  pointer plVar2;
  element_type **ppeVar3;
  size_t *psVar4;
  long lVar5;
  ColourClassOrder CVar6;
  iterator iVar7;
  Proof *pPVar8;
  size_t sVar9;
  pointer plVar10;
  byte bVar11;
  uint uVar12;
  pointer __first;
  bool bVar13;
  int __tmp;
  SearchResult SVar14;
  uint uVar15;
  undefined4 uVar16;
  int iVar17;
  void *pvVar18;
  CliqueParams *extraout_RAX;
  CliqueParams *extraout_RAX_00;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var19;
  undefined8 uVar20;
  _List_node_base *p_Var21;
  CliqueParams *pCVar22;
  CliqueParams *extraout_RAX_01;
  ulong extraout_RAX_02;
  undefined8 extraout_RAX_03;
  int iVar23;
  int iVar24;
  long lVar25;
  uint *__args;
  int v_1;
  CliqueRunner *this_00;
  _Self __tmp_1;
  ulong uVar26;
  pointer plVar27;
  ulong uVar28;
  ulong uVar29;
  int *piVar30;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __i;
  ulong uVar31;
  int *piVar32;
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  int in_stack_fffffffffffffdd8;
  uint local_224;
  CliqueRunner *local_220;
  Incumbent *local_218;
  int local_20c;
  int *local_208;
  int *local_200;
  int *local_1f8;
  ulong local_1f0;
  int *local_1e8;
  ulong local_1e0;
  vector<int,std::allocator<int>> *local_1d8;
  unsigned_long_long *local_1d0;
  unsigned_long_long *local_1c8;
  ulong local_1c0;
  vector<int,_std::allocator<int>_> p_order_prelim;
  vector<int,_std::allocator<int>_> colour_sizes;
  SVOBitset p_left;
  anon_union_128_2_84168a9f_for__data local_f8;
  uint local_78;
  vector<int,_std::allocator<int>_> sorted_order;
  vector<int,_std::allocator<int>_> colour_start;
  
  *nodes = *nodes + 1;
  *prove_nodes = *prove_nodes + 1;
  piVar32 = this->space;
  uVar31 = (ulong)a;
  local_200 = piVar32 + uVar31;
  iVar17 = this->size;
  uVar26 = (ulong)(a + iVar17);
  local_1e8 = piVar32 + uVar26;
  local_224 = 0;
  CVar6 = this->params->colour_class_order;
  local_220 = this;
  local_1d8 = (vector<int,std::allocator<int>> *)c;
  local_1d0 = find_nodes;
  local_1c8 = prove_nodes;
  if (CVar6 == Sorted) {
    gss::innards::SVOBitset::SVOBitset(&p_left,p);
    local_224 = 0;
    std::vector<int,_std::allocator<int>_>::vector
              (&p_order_prelim,(long)this->size,(allocator_type *)&local_f8);
    std::vector<int,_std::allocator<int>_>::vector
              (&colour_sizes,(long)this->size,(allocator_type *)&local_f8);
    std::vector<int,_std::allocator<int>_>::vector
              (&colour_start,(long)this->size,(allocator_type *)&local_f8);
    std::vector<int,_std::allocator<int>_>::vector
              (&sorted_order,(long)this->size,(allocator_type *)&local_f8);
    bVar13 = gss::innards::SVOBitset::any(&p_left);
    uVar26 = 0;
    if (bVar13) {
      uVar26 = 0;
      uVar31 = (ulong)local_224;
      do {
        colour_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar26] = (int)uVar31;
        colour_sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar26] = 0;
        local_78 = p_left.n_words;
        local_1f0 = uVar26;
        if ((ulong)p_left.n_words < 0x11) {
          auVar34._8_8_ = p_left._data.short_data[1];
          auVar34._0_8_ = p_left._data.short_data[0];
          auVar34._16_8_ = p_left._data.short_data[2];
          auVar34._24_40_ = p_left._data._24_40_;
          auVar33 = vmovdqu64_avx512f(auVar34);
          auVar34 = vmovdqu64_avx512f(p_left._data._64_64_);
          local_f8._64_64_ = vmovdqu64_avx512f(auVar34);
          local_f8._0_64_ = vmovdqu64_avx512f(auVar33);
        }
        else {
          uVar28 = (ulong)p_left.n_words << 3;
          pvVar18 = operator_new__(uVar28);
          local_f8.long_data = (BitWord *)pvVar18;
          memmove(pvVar18,p_left._data.long_data,uVar28);
        }
        bVar13 = gss::innards::SVOBitset::any((SVOBitset *)&local_f8);
        if (bVar13) {
          uVar31 = (ulong)(int)uVar31;
          do {
            uVar15 = local_78;
            uVar28 = (ulong)local_78;
            uVar20 = (SVOBitset *)&local_f8;
            if (0x10 < uVar28) {
              uVar20 = local_f8.short_data[0];
            }
            iVar17 = -1;
            if (uVar28 != 0) {
              lVar25 = 0;
LAB_00117105:
              uVar29 = (((SVOBitset *)uVar20)->_data).short_data[0];
              if (uVar29 == 0) goto code_r0x0011710d;
              iVar17 = 0;
              for (; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000) {
                iVar17 = iVar17 + 1;
              }
              iVar17 = iVar17 - (int)lVar25;
            }
LAB_00117127:
            uVar20 = &p_left;
            if (0x10 < p_left.n_words) {
              uVar20 = p_left._data.short_data[0];
            }
            bVar11 = (byte)iVar17 & 0x3f;
            uVar28 = -2L << bVar11 | 0xfffffffffffffffeU >> 0x40 - bVar11;
            iVar24 = iVar17 + 0x3f;
            if (-1 < iVar17) {
              iVar24 = iVar17;
            }
            (((SVOBitset *)uVar20)->_data).short_data[iVar24 >> 6] =
                 (((SVOBitset *)uVar20)->_data).short_data[iVar24 >> 6] & uVar28;
            uVar20 = (SVOBitset *)&local_f8;
            if (0x10 < uVar15) {
              uVar20 = local_f8.short_data[0];
            }
            puVar1 = (ulong *)((long)(((SVOBitset *)uVar20)->_data).short_data +
                              (long)(iVar24 >> 6) * 8);
            *puVar1 = *puVar1 & uVar28;
            gss::innards::SVOBitset::intersect_with_complement
                      ((SVOBitset *)&local_f8,
                       (this->adj).
                       super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                       ._M_impl.super__Vector_impl_data._M_start + iVar17);
            *(int *)(CONCAT44(p_order_prelim.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_,
                              (int)p_order_prelim.super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_start) + uVar31 * 4) = iVar17;
            uVar31 = uVar31 + 1;
            colour_sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar26] =
                 colour_sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar26] + 1;
            bVar13 = gss::innards::SVOBitset::any((SVOBitset *)&local_f8);
          } while (bVar13);
        }
        uVar26 = local_1f0;
        if ((0x10 < local_78) && ((void *)local_f8.short_data[0] != (void *)0x0)) {
          operator_delete__(local_f8.long_data);
        }
        uVar26 = (ulong)((int)uVar26 + 1);
        bVar13 = gss::innards::SVOBitset::any(&p_left);
      } while (bVar13);
      local_224 = (uint)uVar31;
    }
    __first = sorted_order.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((uint)uVar26 != 0) {
      _Var19._M_current =
           sorted_order.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start + uVar26;
      auVar33 = vpbroadcastq_avx512f();
      auVar33 = vpsrlq_avx512f(auVar33,2);
      auVar34 = vpmovsxbd_avx512f(_DAT_00141f10);
      uVar31 = 0;
      auVar35 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar36 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar37 = vpbroadcastd_avx512f(ZEXT416(0x10));
      do {
        auVar38 = vpbroadcastq_avx512f();
        auVar39 = vporq_avx512f(auVar38,auVar35);
        auVar38 = vporq_avx512f(auVar38,auVar36);
        vpcmpuq_avx512f(auVar38,auVar33,2);
        vpcmpuq_avx512f(auVar39,auVar33,2);
        auVar38 = vmovdqu32_avx512f(auVar34);
        *(undefined1 (*) [64])
         (sorted_order.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_start + uVar31) = auVar38;
        uVar31 = uVar31 + 0x10;
        auVar34 = vpaddd_avx512f(auVar34,auVar37);
      } while (((uVar26 * 4 - 4 >> 2) + 0x10 & 0xfffffffffffffff0) != uVar31);
      if (uVar26 != 0) {
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::CliqueRunner::colour_class_order_sorted(gss::innards::SVOBitset_const&,int*,int*,int&)::_lambda(int,int)_1_>>
                  ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                   sorted_order.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,_Var19,
                   (ulong)(uint)((int)LZCOUNT(uVar26) * 2) ^ 0x7e,
                   (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ciaranm[P]glasgow_subgraph_solver_gss_clique_cc:351:71)>
                    )&colour_sizes);
        if ((uint)uVar26 < 0x11) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::CliqueRunner::colour_class_order_sorted(gss::innards::SVOBitset_const&,int*,int*,int&)::_lambda(int,int)_1_>>
                    ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__first,
                     _Var19,(_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ciaranm[P]glasgow_subgraph_solver_gss_clique_cc:351:71)>
                             )&colour_sizes);
        }
        else {
          _Var19._M_current = __first + 0x10;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::CliqueRunner::colour_class_order_sorted(gss::innards::SVOBitset_const&,int*,int*,int&)::_lambda(int,int)_1_>>
                    ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__first,
                     _Var19,(_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ciaranm[P]glasgow_subgraph_solver_gss_clique_cc:351:71)>
                             )&colour_sizes);
          lVar25 = uVar26 * 4 + -0x40;
          do {
            std::
            __unguarded_linear_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Val_comp_iter<(anonymous_namespace)::CliqueRunner::colour_class_order_sorted(gss::innards::SVOBitset_const&,int*,int*,int&)::_lambda(int,int)_1_>>
                      (_Var19,(_Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ciaranm[P]glasgow_subgraph_solver_gss_clique_cc:351:71)>
                               )&colour_sizes);
            _Var19._M_current = _Var19._M_current + 1;
            lVar25 = lVar25 + -4;
          } while (lVar25 != 0);
        }
        if (uVar26 != 0) {
          uVar31 = 0;
          iVar17 = 0;
          do {
            if (0 < colour_sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start
                    [sorted_order.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar31]]) {
              iVar24 = colour_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start
                       [sorted_order.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar31]];
              lVar25 = 0;
              do {
                local_1e8[iVar17 + lVar25] = (int)uVar31 + 1;
                local_200[iVar17 + lVar25] =
                     *(int *)(CONCAT44(p_order_prelim.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start._4_4_,
                                       (int)p_order_prelim.
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_start) + (long)iVar24 * 4 +
                             lVar25 * 4);
                lVar5 = (long)iVar24 + 1 + lVar25;
                lVar25 = lVar25 + 1;
              } while (lVar5 < (long)colour_sizes.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_start
                                     [sorted_order.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start[uVar31]] +
                               (long)colour_start.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_start
                                     [sorted_order.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start[uVar31]]);
              iVar17 = iVar17 + (int)lVar25;
            }
            uVar31 = uVar31 + 1;
          } while (uVar31 != uVar26);
        }
      }
    }
    if (sorted_order.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(sorted_order.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)sorted_order.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)sorted_order.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    c = (vector<int,_std::allocator<int>_> *)local_1d8;
    if (colour_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(colour_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)colour_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)colour_start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    this = local_220;
    if (colour_sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(colour_sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)colour_sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)colour_sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    pvVar18 = (void *)CONCAT44(p_order_prelim.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start._4_4_,
                               (int)p_order_prelim.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
    if (pvVar18 != (void *)0x0) {
      operator_delete(pvVar18,(long)p_order_prelim.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)pvVar18);
    }
  }
  else {
    if (CVar6 != SingletonsFirst) {
      if (CVar6 == ColourOrder) {
        colour_class_order(this,p,local_200,local_1e8,(int *)&local_224);
      }
      goto LAB_0011743a;
    }
    gss::innards::SVOBitset::SVOBitset(&p_left,p);
    local_224 = 0;
    bVar13 = gss::innards::SVOBitset::any(&p_left);
    uVar28 = 0;
    piVar30 = piVar32 + (a + iVar17 * 2);
    uVar15 = 0;
    if (bVar13) {
      uVar28 = 0;
      uVar29 = (ulong)local_224;
      local_218 = (Incumbent *)((ulong)local_218 & 0xffffffff00000000);
      local_208 = piVar32 + (a + iVar17 * 2);
      local_1f8 = piVar32;
      local_1e0 = uVar31;
      local_1c0 = uVar26;
      do {
        local_78 = p_left.n_words;
        if ((ulong)p_left.n_words < 0x11) {
          auVar33._8_8_ = p_left._data.short_data[1];
          auVar33._0_8_ = p_left._data.short_data[0];
          auVar33._16_8_ = p_left._data.short_data[2];
          auVar33._24_40_ = p_left._data._24_40_;
          auVar33 = vmovdqu64_avx512f(auVar33);
          auVar34 = vmovdqu64_avx512f(p_left._data._64_64_);
          local_f8._64_64_ = vmovdqu64_avx512f(auVar34);
          local_f8._0_64_ = vmovdqu64_avx512f(auVar33);
        }
        else {
          uVar26 = (ulong)p_left.n_words << 3;
          pvVar18 = operator_new__(uVar26);
          local_f8.long_data = (BitWord *)pvVar18;
          memmove(pvVar18,p_left._data.long_data,uVar26);
        }
        uVar15 = (int)uVar28 + 1;
        bVar13 = gss::innards::SVOBitset::any((SVOBitset *)&local_f8);
        if (bVar13) {
          uVar29 = (long)(int)uVar29;
          iVar17 = 0;
          local_1f0 = uVar28;
          do {
            iVar24 = iVar17;
            uVar31 = uVar29;
            uVar12 = local_78;
            uVar26 = (ulong)local_78;
            uVar20 = (SVOBitset *)&local_f8;
            if (0x10 < uVar26) {
              uVar20 = local_f8.short_data[0];
            }
            iVar17 = -1;
            if (uVar26 != 0) {
              lVar25 = 0;
LAB_00116dd2:
              uVar28 = (((SVOBitset *)uVar20)->_data).short_data[0];
              if (uVar28 == 0) goto code_r0x00116dda;
              iVar17 = 0;
              for (; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
                iVar17 = iVar17 + 1;
              }
              iVar17 = iVar17 - (int)lVar25;
            }
LAB_00116df4:
            uVar20 = &p_left;
            if (0x10 < p_left.n_words) {
              uVar20 = p_left._data.short_data[0];
            }
            bVar11 = (byte)iVar17 & 0x3f;
            uVar26 = -2L << bVar11 | 0xfffffffffffffffeU >> 0x40 - bVar11;
            iVar23 = iVar17 + 0x3f;
            if (-1 < iVar17) {
              iVar23 = iVar17;
            }
            (((SVOBitset *)uVar20)->_data).short_data[iVar23 >> 6] =
                 (((SVOBitset *)uVar20)->_data).short_data[iVar23 >> 6] & uVar26;
            uVar20 = (SVOBitset *)&local_f8;
            if (0x10 < uVar12) {
              uVar20 = local_f8.short_data[0];
            }
            puVar1 = (ulong *)((long)(((SVOBitset *)uVar20)->_data).short_data +
                              (long)(iVar23 >> 6) * 8);
            *puVar1 = *puVar1 & uVar26;
            gss::innards::SVOBitset::intersect_with_complement
                      ((SVOBitset *)&local_f8,
                       (local_220->adj).
                       super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                       ._M_impl.super__Vector_impl_data._M_start + iVar17);
            local_1e8[uVar31] = uVar15;
            local_200[uVar31] = iVar17;
            uVar29 = uVar31 + 1;
            bVar13 = gss::innards::SVOBitset::any((SVOBitset *)&local_f8);
            iVar17 = iVar24 + 1;
          } while (bVar13);
          this = local_220;
          if (iVar24 == 0) {
            uVar26 = (ulong)local_218 & 0xffffffff;
            local_218 = (Incumbent *)CONCAT44(local_218._4_4_,(uint)local_218 + 1);
            local_208[uVar26] = local_200[uVar31];
            uVar29 = uVar31 & 0xffffffff;
            uVar28 = local_1f0;
          }
          else {
            uVar28 = (ulong)uVar15;
          }
        }
        else {
          uVar28 = (ulong)uVar15;
        }
        if ((0x10 < local_78) && ((void *)local_f8.short_data[0] != (void *)0x0)) {
          operator_delete__(local_f8.long_data);
        }
        bVar13 = gss::innards::SVOBitset::any(&p_left);
      } while (bVar13);
      local_224 = (uint)uVar29;
      uVar26 = local_1c0;
      piVar30 = local_208;
      uVar31 = local_1e0;
      c = (vector<int,_std::allocator<int>_> *)local_1d8;
      piVar32 = local_1f8;
      uVar15 = (uint)local_218;
    }
    if (uVar15 != 0) {
      uVar29 = 0;
      do {
        piVar32[(long)(int)local_224 + uVar31 + uVar29] = piVar30[uVar29];
        piVar32[(long)(int)local_224 + uVar26 + uVar29] = (int)uVar28 + 1 + (int)uVar29;
        uVar29 = uVar29 + 1;
      } while (uVar15 != uVar29);
      local_224 = local_224 + (int)uVar29;
    }
  }
  if ((0x10 < p_left.n_words) && ((void *)p_left._data.short_data[0] != (void *)0x0)) {
    operator_delete__(p_left._data.long_data);
  }
LAB_0011743a:
  uVar26 = (ulong)local_224;
  local_218 = &this->incumbent;
  local_20c = depth + 1;
  pCVar22 = (CliqueParams *)(ulong)(local_224 - 1);
  local_1e0 = CONCAT44(local_1e0._4_4_,local_224 - 1);
  do {
    local_1f8 = (int *)CONCAT44(local_1f8._4_4_,
                                (int)CONCAT71((int7)((ulong)pCVar22 >> 8),(int)uVar26 < 1));
    if ((int)uVar26 < 1) {
LAB_00117bd1:
      SVar14 = (SearchResult)local_208;
      goto LAB_00117bd5;
    }
    bVar13 = gss::Timeout::should_abort
                       ((this->params->timeout).
                        super___shared_ptr<gss::Timeout,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    if (bVar13) {
      SVar14 = Aborted;
      goto LAB_00117bd5;
    }
    iVar7._M_current = *(int **)((long)c + 8);
    uVar15 = local_1e8[uVar26 - 1];
    if ((ulong)(((long)iVar7._M_current - *(long *)c >> 2) + (long)(int)uVar15) <=
        (ulong)local_218->value) {
      if ((this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          != (element_type *)0x0) {
        p_left._data.short_data[0] = 0;
        p_left._data.short_data[1] = 0;
        p_left._data.short_data[2] = 0;
        uVar31 = 0;
        SVar14 = (SearchResult)local_208;
        do {
          if ((uVar31 == 0) || (local_1e8[uVar31 - 1] != local_1e8[uVar31])) {
            if (p_left._data.short_data[1] == p_left._data.short_data[2]) {
              std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::_M_realloc_insert<>
                        ((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          *)&p_left,(iterator)p_left._data.short_data[1]);
            }
            else {
              *(undefined1 (*) [16])p_left._data.short_data[1] = (undefined1  [16])0x0;
              *(undefined8 *)(p_left._data.short_data[1] + 0x10) = 0;
              p_left._data.short_data[1] = p_left._data.short_data[1] + 0x18;
            }
          }
          __args = (uint *)((local_220->order).super__Vector_base<int,_std::allocator<int>_>._M_impl
                            .super__Vector_impl_data._M_start + local_200[uVar31]);
          iVar7._M_current = *(int **)(p_left._data.short_data[1] - 0x10);
          if (iVar7._M_current == *(int **)(p_left._data.short_data[1] - 8)) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)(p_left._data.short_data[1] - 0x18),iVar7,
                       (int *)__args);
            uVar28 = extraout_RAX_02;
          }
          else {
            uVar15 = *__args;
            uVar28 = (ulong)uVar15;
            *iVar7._M_current = uVar15;
            *(int **)(p_left._data.short_data[1] - 0x10) = iVar7._M_current + 1;
          }
          this = local_220;
          uVar31 = uVar31 + 1;
        } while (uVar26 != uVar31);
        local_1f8 = (int *)CONCAT44(local_1f8._4_4_,(int)CONCAT71((int7)(uVar28 >> 8),1));
        gss::innards::Proof::colour_bound
                  ((local_220->proof).
                   super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    *)&p_left);
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *)&p_left);
        goto LAB_00117bd5;
      }
      local_1f8 = (int *)CONCAT44(local_1f8._4_4_,(int)CONCAT71((int7)(int3)(uVar15 >> 8),1));
      goto LAB_00117bd1;
    }
    if (uVar26 == uVar15) {
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&p_left,c)
      ;
      piVar32 = local_200 + (local_1e0 & 0xffffffff);
      SVar14 = (SearchResult)local_208;
      do {
        iVar7._M_current = *(int **)((long)c + 8);
        if (iVar7._M_current == *(int **)((long)c + 0x10)) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)c,iVar7,piVar32);
        }
        else {
          *iVar7._M_current = *piVar32;
          *(int **)((long)c + 8) = iVar7._M_current + 1;
        }
        uVar15 = (int)uVar26 - 1;
        uVar26 = (ulong)uVar15;
        piVar32 = piVar32 + -1;
      } while (0 < (int)uVar15);
      Incumbent::update(local_218,c,local_1d0,local_1c8);
      pPVar8 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      if ((pPVar8 != (Proof *)0x0) &&
         ((this->params->decide).super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._M_engaged == false)) {
        gss::innards::Proof::start_level(pPVar8,0);
        pPVar8 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        unpermute_and_finish
                  ((vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *)&local_f8
                   ,this,c);
        gss::innards::Proof::new_incumbent
                  (pPVar8,(vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *)
                          &local_f8);
        if ((void *)local_f8.short_data[0] != (void *)0x0) {
          operator_delete(local_f8.long_data,local_f8.short_data[2] - local_f8._0_8_);
        }
        gss::innards::Proof::start_level
                  ((this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr,local_20c);
      }
      pCVar22 = this->params;
      if ((((pCVar22->decide).super__Optional_base<unsigned_int,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_int>._M_engaged == true) &&
          ((pCVar22->decide).super__Optional_base<unsigned_int,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_int>._M_payload._M_value <= local_218->value)) ||
         (((pCVar22->stop_after_finding).super__Optional_base<unsigned_int,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_int>._M_engaged == true &&
          ((pCVar22->stop_after_finding).super__Optional_base<unsigned_int,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_int>._M_payload._M_value <= local_218->value)))) {
        pPVar8 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        SVar14 = DecidedTrue;
        if (pPVar8 != (Proof *)0x0) {
          unpermute((vector<int,_std::allocator<int>_> *)&local_f8,this,c);
          gss::innards::Proof::post_solution(pPVar8,(vector<int,_std::allocator<int>_> *)&local_f8);
          if ((void *)local_f8.short_data[0] != (void *)0x0) {
            operator_delete(local_f8.long_data,local_f8.short_data[2] - local_f8._0_8_);
          }
        }
        uVar16 = 0;
      }
      else {
        std::vector<int,_std::allocator<int>_>::_M_move_assign(c,&p_left);
        uVar16 = (undefined4)CONCAT71((int7)((ulong)extraout_RAX_03 >> 8),1);
      }
      local_1f8 = (int *)CONCAT44(local_1f8._4_4_,uVar16);
      if (p_left._data.short_data[0] != 0) {
        operator_delete(p_left._data.long_data,p_left._data.short_data[2] - p_left._data._0_8_);
      }
LAB_00117bd5:
      if ((char)local_1f8 != '\0') {
        (*((this->params->restarts_schedule)._M_t.
           super___uniq_ptr_impl<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_>
           ._M_t.
           super__Tuple_impl<0UL,_gss::RestartsSchedule_*,_std::default_delete<gss::RestartsSchedule>_>
           .super__Head_base<0UL,_gss::RestartsSchedule_*,_false>._M_head_impl)->
          _vptr_RestartsSchedule[2])();
        iVar17 = (*((this->params->restarts_schedule)._M_t.
                    super___uniq_ptr_impl<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_gss::RestartsSchedule_*,_std::default_delete<gss::RestartsSchedule>_>
                    .super__Head_base<0UL,_gss::RestartsSchedule_*,_false>._M_head_impl)->
                   _vptr_RestartsSchedule[4])();
        SVar14 = Complete;
        if ((char)iVar17 != '\0') {
          post_nogood(this,c);
          SVar14 = Restart;
        }
      }
      return SVar14;
    }
    p_order_prelim.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start._0_4_ = local_200[uVar26 - 1];
    if (iVar7._M_current == *(int **)((long)c + 0x10)) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)c,iVar7,(int *)&p_order_prelim);
    }
    else {
      *iVar7._M_current =
           (int)p_order_prelim.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      *(int **)((long)c + 8) = iVar7._M_current + 1;
    }
    pCVar22 = this->params;
    if ((pCVar22->decide).super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_engaged == false) {
      if ((pCVar22->stop_after_finding).super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._M_engaged == true) goto LAB_00117511;
      pPVar8 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      if (((pPVar8 != (Proof *)0x0) &&
          ((ulong)local_218->value < (ulong)(*(long *)((long)c + 8) - *(long *)c >> 2))) &&
         (pCVar22->proof_is_for_hom == false)) {
        gss::innards::Proof::start_level(pPVar8,0);
        pPVar8 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        unpermute_and_finish
                  ((vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *)&p_left,
                   this,c);
        gss::innards::Proof::new_incumbent
                  (pPVar8,(vector<std::pair<int,_bool>,_std::allocator<std::pair<int,_bool>_>_> *)
                          &p_left);
        if (p_left._data.short_data[0] != 0) {
          operator_delete(p_left._data.long_data,p_left._data.short_data[2] - p_left._data._0_8_);
        }
        gss::innards::Proof::start_level
                  ((this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr,local_20c);
      }
      Incumbent::update(local_218,c,local_1d0,local_1c8);
LAB_00117614:
      gss::innards::SVOBitset::SVOBitset(&p_left,p);
      gss::innards::SVOBitset::operator&=
                (&p_left,(this->adj).
                         super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                         ._M_impl.super__Vector_impl_data._M_start +
                         (int)p_order_prelim.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      iVar17 = (*((this->params->restarts_schedule)._M_t.
                  super___uniq_ptr_impl<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_gss::RestartsSchedule_*,_std::default_delete<gss::RestartsSchedule>_>
                  .super__Head_base<0UL,_gss::RestartsSchedule_*,_false>._M_head_impl)->
                 _vptr_RestartsSchedule[5])();
      local_1c0 = uVar26;
      if ((char)iVar17 != '\0') {
        local_1f0 = (ulong)(int)p_order_prelim.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                .super__Vector_impl_data._M_start;
        plVar2 = (local_220->watches).table.data.
                 super__Vector_base<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<int>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<int>_>_>_>,_std::allocator<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<int>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<int>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + local_1f0;
        plVar27 = *(pointer *)
                   &(plVar2->
                    super__List_base<std::_List_iterator<gss::innards::Nogood<int>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<int>_>_>_>
                    )._M_impl;
LAB_00117683:
        if (plVar27 != plVar2) {
          sVar9 = (plVar27->
                  super__List_base<std::_List_iterator<gss::innards::Nogood<int>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<int>_>_>_>
                  )._M_impl._M_node._M_size;
          piVar32 = *(int **)(sVar9 + 0x10);
          iVar17 = *piVar32;
          if (iVar17 != (int)local_1f0) {
            *piVar32 = piVar32[1];
            piVar32[1] = iVar17;
          }
          for (piVar32 = piVar32 + 2; piVar32 != *(int **)(sVar9 + 0x18); piVar32 = piVar32 + 1) {
            local_f8.short_data[0]._0_4_ = *piVar32;
            piVar30 = *(int **)(local_1d8 + 8);
            _Var19 = std::
                     __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                               (*(undefined8 *)local_1d8,piVar30,
                                (vector<int,_std::allocator<int>_> *)&local_f8);
            if (piVar30 == _Var19._M_current) {
              piVar30 = *(int **)(sVar9 + 0x10);
              iVar17 = *piVar30;
              *piVar30 = *piVar32;
              *piVar32 = iVar17;
              iVar17 = *piVar30;
              plVar10 = (local_220->watches).table.data.
                        super__Vector_base<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<int>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<int>_>_>_>,_std::allocator<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<int>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<int>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              p_Var21 = (_List_node_base *)operator_new(0x18);
              p_Var21[1]._M_next =
                   (_List_node_base *)
                   (plVar27->
                   super__List_base<std::_List_iterator<gss::innards::Nogood<int>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<int>_>_>_>
                   )._M_impl._M_node._M_size;
              std::__detail::_List_node_base::_M_hook(p_Var21);
              psVar4 = &plVar10[iVar17].
                        super__List_base<std::_List_iterator<gss::innards::Nogood<int>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<int>_>_>_>
                        ._M_impl._M_node._M_size;
              *psVar4 = *psVar4 + 1;
              plVar10 = *(pointer *)
                         &(plVar27->
                          super__List_base<std::_List_iterator<gss::innards::Nogood<int>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<int>_>_>_>
                          )._M_impl;
              psVar4 = &(plVar2->
                        super__List_base<std::_List_iterator<gss::innards::Nogood<int>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<int>_>_>_>
                        )._M_impl._M_node._M_size;
              *psVar4 = *psVar4 - 1;
              std::__detail::_List_node_base::_M_unhook();
              operator_delete(plVar27,0x18);
              plVar27 = plVar10;
              goto LAB_00117683;
            }
          }
          uVar20 = &p_left;
          if (0x10 < p_left.n_words) {
            uVar20 = p_left._data.short_data[0];
          }
          iVar17 = *(int *)(*(long *)(sVar9 + 0x10) + 4);
          bVar11 = (byte)iVar17 & 0x3f;
          iVar24 = iVar17 + 0x3f;
          if (-1 < iVar17) {
            iVar24 = iVar17;
          }
          (((SVOBitset *)uVar20)->_data).short_data[iVar24 >> 6] =
               (((SVOBitset *)uVar20)->_data).short_data[iVar24 >> 6] &
               (-2L << bVar11 | 0xfffffffffffffffeU >> 0x40 - bVar11);
          plVar27 = *(pointer *)
                     &(plVar27->
                      super__List_base<std::_List_iterator<gss::innards::Nogood<int>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<int>_>_>_>
                      )._M_impl;
          goto LAB_00117683;
        }
      }
      uVar26 = local_1c0;
      c = (vector<int,_std::allocator<int>_> *)local_1d8;
      this_00 = local_220;
      pPVar8 = (local_220->proof).
               super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (pPVar8 != (Proof *)0x0) {
        gss::innards::Proof::start_level(pPVar8,local_20c);
      }
      bVar13 = gss::innards::SVOBitset::any(&p_left);
      if (bVar13) {
        SVar14 = expand<false>(this_00,local_20c,nodes,local_1d0,local_1c8,c,&p_left,
                               a + this_00->size * 2,in_stack_fffffffffffffdd8);
        pCVar22 = (CliqueParams *)0x0;
        if (SVar14 != Aborted) {
          if (SVar14 == Restart) {
            *(long *)((long)c + 8) = *(long *)((long)c + 8) + -4;
            uVar31 = (ulong)local_224;
            SVar14 = Restart;
            while ((int)uVar26 < (int)uVar31) {
              uVar31 = (ulong)((int)uVar31 - 1);
              iVar7._M_current = *(int **)((long)c + 8);
              if (iVar7._M_current == *(int **)((long)c + 0x10)) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)c,iVar7,local_200 + uVar31);
              }
              else {
                *iVar7._M_current = local_200[uVar31];
                *(int **)((long)c + 8) = iVar7._M_current + 1;
              }
              post_nogood(local_220,c);
              *(long *)((long)c + 8) = *(long *)((long)c + 8) + -4;
            }
            pCVar22 = (CliqueParams *)0x0;
            this_00 = local_220;
          }
          else if (SVar14 != DecidedTrue) {
            pCVar22 = (CliqueParams *)0x1;
            SVar14 = (SearchResult)local_208;
          }
        }
        if ((char)pCVar22 != '\0') goto LAB_0011787b;
        bVar13 = false;
      }
      else {
        SVar14 = (SearchResult)local_208;
LAB_0011787b:
        pPVar8 = (this_00->proof).
                 super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (pPVar8 != (Proof *)0x0) {
          gss::innards::Proof::start_level(pPVar8,depth);
          pPVar8 = (this_00->proof).
                   super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          unpermute((vector<int,_std::allocator<int>_> *)&local_f8,this_00,c);
          gss::innards::Proof::backtrack_from_binary_variables
                    (pPVar8,(vector<int,_std::allocator<int>_> *)&local_f8);
          if ((void *)local_f8.short_data[0] != (void *)0x0) {
            operator_delete(local_f8.long_data,local_f8.short_data[2] - local_f8._0_8_);
          }
          gss::innards::Proof::forget_level
                    ((this_00->proof).
                     super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     local_20c);
        }
        *(long *)((long)c + 8) = *(long *)((long)c + 8) + -4;
        pCVar22 = (CliqueParams *)p;
        if (0x10 < p->n_words) {
          pCVar22 = (CliqueParams *)(p->_data).short_data[0];
        }
        bVar11 = (byte)(int)p_order_prelim.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start & 0x3f;
        iVar17 = (int)p_order_prelim.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start + 0x3f;
        if (-1 < (int)p_order_prelim.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start) {
          iVar17 = (int)p_order_prelim.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
        }
        ppeVar3 = &(pCVar22->timeout).super___shared_ptr<gss::Timeout,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr + (iVar17 >> 6);
        *ppeVar3 = (element_type *)
                   ((ulong)*ppeVar3 & (-2L << bVar11 | 0xfffffffffffffffeU >> 0x40 - bVar11));
        bVar13 = true;
      }
      if ((0x10 < p_left.n_words) && (p_left._data.short_data[0] != 0)) {
        operator_delete__(p_left._data.long_data);
        pCVar22 = extraout_RAX_01;
      }
    }
    else {
      if (local_218->value <
          (pCVar22->decide).super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._M_payload._M_value) {
LAB_00117511:
        if (((pCVar22->stop_after_finding).super__Optional_base<unsigned_int,_true,_true>._M_payload
             .super__Optional_payload_base<unsigned_int>._M_engaged != true) ||
           (local_218->value <
            (pCVar22->stop_after_finding).super__Optional_base<unsigned_int,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_int>._M_payload._M_value)) goto LAB_00117614;
      }
      pPVar8 = (this->proof).super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      SVar14 = DecidedTrue;
      if (pPVar8 != (Proof *)0x0) {
        unpermute((vector<int,_std::allocator<int>_> *)&p_left,this,c);
        gss::innards::Proof::post_solution(pPVar8,(vector<int,_std::allocator<int>_> *)&p_left);
        pCVar22 = extraout_RAX;
        if (p_left._data.short_data[0] != 0) {
          operator_delete(p_left._data.long_data,p_left._data.short_data[2] - p_left._data._0_8_);
          pCVar22 = extraout_RAX_00;
        }
      }
      bVar13 = false;
    }
    uVar26 = uVar26 - 1;
    local_1e0 = CONCAT44(local_1e0._4_4_,(int)local_1e0 + -1);
    local_208 = (int *)CONCAT44(local_208._4_4_,SVar14);
    this = local_220;
    if (!bVar13) goto LAB_00117bd5;
  } while( true );
code_r0x00116dda:
  lVar25 = lVar25 + -0x40;
  uVar20 = (long)&((SVOBitset *)uVar20)->_data + 8;
  if (uVar26 * 0x40 + lVar25 == 0) goto LAB_00116df4;
  goto LAB_00116dd2;
code_r0x0011710d:
  lVar25 = lVar25 + -0x40;
  uVar20 = (long)&((SVOBitset *)uVar20)->_data + 8;
  if (uVar28 * 0x40 + lVar25 == 0) goto LAB_00117127;
  goto LAB_00117105;
}

Assistant:

auto expand(
            int depth,
            unsigned long long & nodes,
            unsigned long long & find_nodes,
            unsigned long long & prove_nodes,
            vector<int> & c,
            SVOBitset & p,
            conditional_t<connected_, const SVOBitset &, int> a,
            int spacepos) -> SearchResult
        {
            ++nodes;
            ++prove_nodes;

            // initial colouring
            int * p_order = &space[spacepos];
            int * p_bounds = &space[spacepos + size];

            int p_end = 0;

            if constexpr (connected_) {
                if (! c.empty())
                    connected_colour_class_order(p, a, p_order, p_bounds, p_end);
                else
                    colour_class_order(p, p_order, p_bounds, p_end);
            }
            else {
                switch (params.colour_class_order) {
                case ColourClassOrder::ColourOrder: colour_class_order(p, p_order, p_bounds, p_end); break;
                case ColourClassOrder::SingletonsFirst: colour_class_order_2df(p, p_order, p_bounds, &space[spacepos + 2 * size], p_end); break;
                case ColourClassOrder::Sorted: colour_class_order_sorted(p, p_order, p_bounds, p_end); break;
                }
            }

            // for each v in p... (v comes later)
            for (int n = p_end - 1; n >= 0; --n) {
                // bound, timeout or early exit?
                if (params.timeout->should_abort())
                    return SearchResult::Aborted;

                if (c.size() + p_bounds[n] <= incumbent.value) {
                    if (proof) {
                        vector<vector<int>> colour_classes;
                        for (int v = 0; v <= n; ++v) {
                            if (0 == v || p_bounds[v - 1] != p_bounds[v])
                                colour_classes.emplace_back();
                            colour_classes.back().push_back(order[p_order[v]]);
                        }
                        proof->colour_bound(colour_classes);
                    }
                    break;
                }

                // if we've used k colours to colour k vertices, it's a clique. this isn't (I think?) a
                // valid shortcut in the connected case.
                if constexpr (! connected_) {
                    if (p_bounds[n] == n + 1) {
                        auto c_save = c;
                        for (; n >= 0; --n)
                            c.push_back(p_order[n]);
                        incumbent.update(c, find_nodes, prove_nodes);

                        if (proof && ! params.decide) {
                            proof->start_level(0);
                            proof->new_incumbent(unpermute_and_finish(c));
                            proof->start_level(depth + 1);
                        }

                        if ((params.decide && incumbent.value >= *params.decide) ||
                            (params.stop_after_finding && incumbent.value >= *params.stop_after_finding)) {
                            if (proof)
                                proof->post_solution(unpermute(c));

                            return SearchResult::DecidedTrue;
                        }

                        c = move(c_save);

                        break;
                    }
                }

                auto v = p_order[n];

                if constexpr (connected_) {
                    if ((! c.empty()) && (! a.test(v))) {
                        // none of the remaining vertices can give a connected underlying graph
                        if (proof) {
                            auto c_unpermuted = unpermute(c);
                            for (int v = 0; v <= n; ++v)
                                proof->not_connected_in_underlying_graph(unpermute(c), order[p_order[v]]);

                            proof->start_level(depth);
                            proof->backtrack_from_binary_variables(unpermute(c));
                            proof->forget_level(depth + 1);
                        }

                        break;
                    }
                }

                // consider taking v
                c.push_back(v);

                if (params.decide || params.stop_after_finding) {
                    if ((params.decide && incumbent.value >= *params.decide) ||
                        (params.stop_after_finding && incumbent.value >= *params.stop_after_finding)) {
                        if (proof)
                            proof->post_solution(unpermute(c));

                        return SearchResult::DecidedTrue;
                    }
                }
                else {
                    if (proof && c.size() > incumbent.value && ! params.proof_is_for_hom) {
                        proof->start_level(0);
                        proof->new_incumbent(unpermute_and_finish(c));
                        proof->start_level(depth + 1);
                    }
                    incumbent.update(c, find_nodes, prove_nodes);
                }

                // filter p to contain vertices adjacent to v
                SVOBitset new_p = p;
                new_p &= adj[v];

                if (params.restarts_schedule->might_restart())
                    watches.propagate(
                        v,
                        [&](int literal) { return c.end() == find(c.begin(), c.end(), literal); },
                        [&](int literal) { new_p.reset(literal); });

                if (proof)
                    proof->start_level(depth + 1);

                if (new_p.any()) {
                    auto new_a = a;

                    if constexpr (connected_) {
                        new_a |= connected_table[v];
                    }

                    switch (expand<connected_>(depth + 1, nodes, find_nodes, prove_nodes, c, new_p, new_a, spacepos + 2 * size)) {
                    case SearchResult::Aborted:
                        return SearchResult::Aborted;

                    case SearchResult::DecidedTrue:
                        return SearchResult::DecidedTrue;

                    case SearchResult::Complete:
                        break;

                    case SearchResult::Restart:
                        // restore assignments before posting nogoods, it's easier
                        c.pop_back();

                        // post nogoods for everything we've done so far
                        for (int m = p_end - 1; m > n; --m) {
                            c.push_back(p_order[m]);
                            post_nogood(c);
                            c.pop_back();
                        }

                        return SearchResult::Restart;
                    }
                }

                if (proof) {
                    proof->start_level(depth);
                    proof->backtrack_from_binary_variables(unpermute(c));
                    proof->forget_level(depth + 1);
                }

                // now consider not taking v
                c.pop_back();
                p.reset(v);
            }

            params.restarts_schedule->did_a_backtrack();
            if (params.restarts_schedule->should_restart()) {
                post_nogood(c);
                return SearchResult::Restart;
            }
            else
                return SearchResult::Complete;
        }